

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O1

void __thiscall
front::irGenerator::irGenerator::ir_declare_const
          (irGenerator *this,string *name,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *values,int id)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  GlobalValue globalValue;
  string local_c0;
  string local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  undefined **local_68;
  variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined4 uStack_38;
  undefined4 uStack_34;
  anon_class_8_1_8991fb9c_conflict2 local_30;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,values);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,&local_80);
  local_60.
  super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
  .
  super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
  .
  super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
  .
  super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
  .
  super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
  ._M_index = 1;
  local_68 = &PTR_display_001f0778;
  local_60.
  super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
  .
  super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
  .
  super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
  .
  super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
  .
  super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
  ._36_4_ = 0;
  uStack_38 = 0;
  uStack_34 = 0;
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + name->_M_string_length);
  getConstName(&local_a0,this,&local_c0,id);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
           ::operator[](&(this->_package).global_values,&local_a0);
  local_30.this =
       (_Copy_assign_base<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)&pmVar2->field_0x8;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_60.
     super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .
     super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
     .
     super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
     .
     super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
     .
     super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
     .
     super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
     ._M_index]._M_data)(&local_30,&local_60);
  *(undefined4 *)
   &(pmVar2->len).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
    ._M_engaged = uStack_34;
  pmVar2->ty = local_60.
               super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
               .
               super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
               .
               super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
               ._36_4_;
  (pmVar2->len).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload = (_Storage<int,_true>)uStack_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_60.
     super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .
     super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
     .
     super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
     .
     super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
     .
     super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
     .
     super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
     ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_a0,&local_60);
  return;
}

Assistant:

void irGenerator::ir_declare_const(string name,
                                   std::vector<std::uint32_t> values, int id) {
  GlobalValue globalValue = GlobalValue(values);
  _package.global_values[getConstName(name, id)] = globalValue;
}